

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_defaultConstructor_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
~optTyped_defaultConstructor_Test
          (optTyped_defaultConstructor_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_> *this)

{
  optTyped_defaultConstructor_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_> *this_local;
  
  ~optTyped_defaultConstructor_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TYPED_TEST(optTyped, defaultConstructor)
{
  using opt_type = typename TestFixture::type;
  opt_type o;
  EXPECT_FALSE(o);
  EXPECT_FALSE(o.has_value());
  EXPECT_THROW(o.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o.value_or(this->value_2));

  const opt_type& co{o};
  EXPECT_FALSE(co);
  EXPECT_FALSE(co.has_value());
  EXPECT_THROW(co.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, co.value_or(this->value_2));
}